

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O3

bool __thiscall Plane::intersect(Plane *this,Ray *r,double *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  PlaneTestCount = PlaneTestCount + 1;
  dVar1 = (this->normal).x;
  dVar2 = (this->normal).y;
  dVar3 = (this->normal).z;
  dVar4 = (r->dir).z * dVar3 + (r->dir).x * dVar1 + (r->dir).y * dVar2;
  if ((0.01 <= ABS(dVar4)) &&
     (dVar4 = -(dVar3 * (r->org).z + dVar1 * (r->org).x + dVar2 * (r->org).y + this->dist) / dVar4,
     *t = dVar4, geom_threshold < dVar4)) {
    return true;
  }
  PlaneTestMisses = PlaneTestMisses + 1;
  return false;
}

Assistant:

bool Plane::intersect(Ray& r, double& t)
{
   STAT( PlaneTestCount++  );

   double vd = normal & r.dir;

   if(   vd > -EPS && vd   < EPS )
   {
      STAT( PlaneTestMisses++ );
      return false;
   }

   t =   -((normal & r.org) + dist) / vd;

   if(   t >   geom_threshold )
      return true;
   else
   {
      STAT(PlaneTestMisses++);
      return false;
   }
}